

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O2

Region * __thiscall Region::GetSelfOrFirstTryAncestor(Region *this)

{
  Region *region;
  Region *pRVar1;
  
  region = this->selfOrFirstTryAncestor;
  pRVar1 = this;
  if (this->selfOrFirstTryAncestor == (Region *)0x0) {
    for (; (pRVar1 != (Region *)0x0 && (pRVar1->type != RegionTypeTry)); pRVar1 = pRVar1->parent) {
    }
    this->selfOrFirstTryAncestor = pRVar1;
    return pRVar1;
  }
  return region;
}

Assistant:

Region *
Region::GetSelfOrFirstTryAncestor()
{
    if (!this->selfOrFirstTryAncestor)
    {
        Region* region = this;
        while (region && region->GetType() != RegionTypeTry)
        {
            region = region->GetParent();
        }
        this->selfOrFirstTryAncestor = region;
    }
    return this->selfOrFirstTryAncestor;
}